

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O0

int AF_A_SorcBallOrbit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  int iVar3;
  MetaClass *pMVar4;
  uint uVar5;
  uint uVar6;
  AActor *pAVar7;
  AHeresiarch *this;
  AActor *pAVar8;
  FState *pFVar9;
  MetaClass *pMVar10;
  bool bVar11;
  bool local_121;
  bool local_de;
  bool local_db;
  TAngle<double> local_d8;
  undefined1 local_d0 [8];
  DVector3 pos;
  FName local_b0;
  FName local_ac;
  TAngle<double> local_a8;
  TAngle<double> local_a0;
  TAngle<double> local_98;
  TAngle<double> local_90;
  TAngle<double> local_88;
  DAngle angle;
  DAngle baseangle;
  DAngle prevangle;
  double dist;
  AHeresiarch *parent;
  int mode;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  ASorcBall *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar11 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar11 = true, (param->field_0).field_1.atag != 1)) {
    bVar11 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar11) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_db = true;
  if (stateowner != (AActor *)0x0) {
    local_db = DObject::IsKindOf((DObject *)stateowner,ASorcBall::RegistrationInfo.MyClass);
  }
  if (local_db == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(ASorcBall))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    bVar11 = false;
    if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar11 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
      bVar11 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar11) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                    ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
    local_de = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_de = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_de == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                    ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  else {
    stateinfo = (FStateParamInfo *)stateowner;
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    bVar11 = false;
    if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar11 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
      bVar11 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar11) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                    ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    _mode = pVStack_20[(int)self].field_0.field_1.a;
  }
  else {
    _mode = (void *)0x0;
  }
  bVar11 = TObjPtr<AActor>::operator==(&stateowner->target,(AActor *)0x0);
  pAVar7 = stateowner;
  if (bVar11) {
    FName::FName((FName *)((long)&parent + 4),NAME_Pain);
    pFVar9 = AActor::FindState(pAVar7,(FName *)((long)&parent + 4));
    AActor::SetState(pAVar7,pFVar9,false);
  }
  else {
    pAVar7 = TObjPtr<AActor>::operator->(&stateowner->target);
    parent._0_4_ = pAVar7->args[3];
    this = barrier_cast<AHeresiarch*,AActor>(&stateowner->target);
    dVar1 = (this->super_AActor).radius;
    dVar2 = stateowner->radius;
    pAVar8 = TObjPtr<AActor>::operator->(&stateowner->target);
    pAVar7 = stateowner;
    if (pAVar8->health < 1) {
      FName::FName((FName *)((long)&prevangle.Degrees + 4),NAME_Pain);
      pFVar9 = AActor::FindState(pAVar7,(FName *)((long)&prevangle.Degrees + 4));
      AActor::SetState(pAVar7,pFVar9,false);
    }
    else {
      TAngle<double>::TAngle
                (&baseangle,(TAngle<double> *)&stateowner[1].super_DThinker.super_DObject.Class);
      TAngle<double>::TAngle(&angle,&this->BallAngle);
      TAngle<double>::TAngle(&local_90,(TAngle<double> *)(stateowner + 1));
      TAngle<double>::operator+(&local_88,&angle);
      TAngle<double>::operator=(&(stateowner->Angles).Yaw,&local_88);
      switch((int)parent) {
      case 0:
        A_DecelBalls(stateowner);
        (*(stateowner->super_DThinker).super_DObject._vptr_DObject[0x26])();
        break;
      case 1:
        A_AccelBalls(stateowner);
        (*(stateowner->super_DThinker).super_DObject._vptr_DObject[0x26])();
        break;
      case 2:
        pMVar4 = (MetaClass *)this->StopBall;
        pMVar10 = AActor::GetClass(stateowner);
        local_121 = false;
        if ((pMVar4 == pMVar10) && (local_121 = false, 5 < (this->super_AActor).args[1])) {
          absangle<double>(&local_98,&local_88);
          local_121 = TAngle<double>::operator<(&local_98,42.1875);
        }
        if (local_121 == false) {
          (*(stateowner->super_DThinker).super_DObject._vptr_DObject[0x26])();
        }
        else {
          pAVar7 = TObjPtr<AActor>::operator->(&stateowner->target);
          pAVar7->args[3] = 3;
          pAVar7 = TObjPtr<AActor>::operator->(&stateowner->target);
          pAVar7->args[4] = 0;
          TAngle<double>::TAngle(&local_a8,(TAngle<double> *)(stateowner + 1));
          TAngle<double>::operator-(&local_a0,&(this->super_AActor).Angles.Yaw);
          TAngle<double>::operator=(&this->BallAngle,&local_a0);
        }
        break;
      case 3:
        pMVar4 = (MetaClass *)this->StopBall;
        pMVar10 = AActor::GetClass(stateowner);
        if (pMVar4 == pMVar10) {
          if (0 < (this->super_AActor).health) {
            FName::FName(&local_ac,"Attack1");
            pFVar9 = AActor::FindState(&this->super_AActor,&local_ac);
            AActor::SetState(&this->super_AActor,pFVar9,false);
          }
          (*(stateowner->super_DThinker).super_DObject._vptr_DObject[0x25])();
        }
        break;
      case 4:
        break;
      case 5:
        (*(stateowner->super_DThinker).super_DObject._vptr_DObject[0x26])();
        break;
      case 6:
        pMVar4 = (MetaClass *)this->StopBall;
        pMVar10 = AActor::GetClass(stateowner);
        if (pMVar4 == pMVar10) {
          iVar3 = stateowner->special2;
          stateowner->special2 = iVar3 + -1;
          if (iVar3 < 1) {
            (this->super_AActor).args[3] = 4;
            if (0 < (this->super_AActor).health) {
              FName::FName(&local_b0,"Attack2");
              pFVar9 = AActor::FindState(&this->super_AActor,&local_b0);
              AActor::SetState(&this->super_AActor,pFVar9,false);
            }
          }
          else {
            A_SorcOffense2(stateowner);
          }
        }
      }
      uVar5 = TAngle<double>::BAMs(&local_88);
      uVar6 = TAngle<double>::BAMs(&baseangle);
      pAVar7 = stateowner;
      if ((uVar5 < uVar6) && ((this->super_AActor).args[4] == 0x19)) {
        (this->super_AActor).args[1] = (this->super_AActor).args[1] + 1;
        FSoundID::FSoundID((FSoundID *)((long)&pos.Z + 4),"SorcererBallWoosh");
        S_Sound(pAVar7,4,(FSoundID *)((long)&pos.Z + 4),1.0,1.0);
      }
      TAngle<double>::operator=
                ((TAngle<double> *)&stateowner[1].super_DThinker.super_DObject.Class,&local_88);
      TAngle<double>::TAngle(&local_d8,&local_88);
      AActor::Vec3Angle((DVector3 *)local_d0,&this->super_AActor,dVar1 - dVar2 * 2.0,&local_d8,
                        -(this->super_AActor).Floorclip + (this->super_AActor).Height,false);
      AActor::SetOrigin(stateowner,(DVector3 *)local_d0,true);
      stateowner->floorz = (this->super_AActor).floorz;
      stateowner->ceilingz = (this->super_AActor).ceilingz;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcBallOrbit)
{
	PARAM_ACTION_PROLOGUE_TYPE(ASorcBall);

	// [RH] If no parent, then die instead of crashing
	if (self->target == NULL)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	int mode = self->target->args[3];
	AHeresiarch *parent = barrier_cast<AHeresiarch *>(self->target);
	double dist = parent->radius - (self->radius*2);

#if 0
	// This cannot happen anymore because this is defined locally in SorcBall
	if (!self->IsKindOf (RUNTIME_CLASS(ASorcBall)))
	{
		I_Error ("Corrupted sorcerer:\nTried to use a %s", self->GetClass()->TypeName.GetChars());
	}
#endif

	if (self->target->health <= 0)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	DAngle prevangle = self->OldAngle;
	DAngle baseangle = parent->BallAngle;
	DAngle angle = baseangle + self->AngleOffset;

	self->Angles.Yaw = angle;

	switch (mode)
	{
	case SORC_NORMAL:			// Balls rotating normally
		self->SorcUpdateBallAngle ();
		break;

	case SORC_DECELERATE:		// Balls decelerating
		A_DecelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_ACCELERATE:		// Balls accelerating
		A_AccelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_STOPPING:			// Balls stopping
		if ((parent->StopBall == self->GetClass()) &&
			 (parent->args[1] > SORCBALL_SPEED_ROTATIONS) &&
			 absangle(angle, parent->Angles.Yaw) < 42.1875)
		{
			// Can stop now
			self->target->args[3] = SORC_FIRESPELL;
			self->target->args[4] = 0;
			// Set angle so self angle == sorcerer angle
			parent->BallAngle = parent->Angles.Yaw - self->AngleOffset;
		}
		else
		{
			self->SorcUpdateBallAngle ();
		}
		break;

	case SORC_FIRESPELL:			// Casting spell
		if (parent->StopBall == self->GetClass())
		{
			// Put sorcerer into special throw spell anim
			if (parent->health > 0)
				parent->SetState (parent->FindState("Attack1"));

			self->DoFireSpell ();
		}
		break;

	case SORC_FIRING_SPELL:
		if (parent->StopBall == self->GetClass())
		{
			if (self->special2-- <= 0)
			{
				// Done rapid firing 
				parent->args[3] = SORC_STOPPED;
				// Back to orbit balls
				if (parent->health > 0)
					parent->SetState (parent->FindState("Attack2"));
			}
			else
			{
				// Do rapid fire spell
				A_SorcOffense2(self);
			}
		}
		break;

	case SORC_STOPPED:			// Balls stopped
	default:
		break;
	}

	if ( angle.BAMs() < prevangle.BAMs() && (parent->args[4]==SORCBALL_TERMINAL_SPEED))
	{
		parent->args[1]++;			// Bump rotation counter
		// Completed full rotation - make woosh sound
		S_Sound (self, CHAN_BODY, "SorcererBallWoosh", 1, ATTN_NORM);
	}
	self->OldAngle = angle;		// Set previous angle

	DVector3 pos = parent->Vec3Angle(dist, angle, -parent->Floorclip + parent->Height);
	self->SetOrigin (pos, true);
	self->floorz = parent->floorz;
	self->ceilingz = parent->ceilingz;
	return 0;
}